

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::CallForHelp::CallForHelp(CallForHelp *this)

{
  allocator<char> local_31;
  string local_30;
  CallForHelp *local_10;
  CallForHelp *this_local;
  
  local_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"This should be caught in your main function, see examples",
             &local_31);
  CallForHelp(this,&local_30,Success);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

CallForHelp() : CallForHelp("This should be caught in your main function, see examples", ExitCodes::Success) {}